

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O3

void __thiscall cubeb_async_logger::start(cubeb_async_logger *this)

{
  __pointer_type prVar1;
  _Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_> __s;
  
  prVar1 = (__pointer_type)operator_new(0x18);
  prVar1->capacity_ = 0x29;
  __s.super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl =
       (_Head_base<0UL,_cubeb_log_message_*,_false>)operator_new__(0x2900);
  memset((void *)__s.super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl,0,0x2900);
  (prVar1->data_)._M_t.
  super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>._M_t.
  super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>.
  super__Head_base<0UL,_cubeb_log_message_*,_false> =
       __s.super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl;
  LOCK();
  (prVar1->write_index_).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (prVar1->read_index_).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->msg_queue)._M_b._M_p = prVar1;
  UNLOCK();
  LOCK();
  (this->msg_queue_consumer)._M_b._M_p = prVar1;
  UNLOCK();
  LOCK();
  (this->shutdown_thread)._M_base._M_i = false;
  UNLOCK();
  run(this);
  return;
}

Assistant:

void start()
  {
    auto * queue =
        new lock_free_queue<cubeb_log_message>(CUBEB_LOG_MESSAGE_QUEUE_DEPTH);
    msg_queue.store(queue);
    msg_queue_consumer.store(queue);
    shutdown_thread = false;
    run();
  }